

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr *
kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>
::FindOrCreateImpl<kj::_::(anonymous_namespace)::TestCase29::run()::$_2,kj::StringPtr&>::apply<0ul>
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          char (*params) [7],Type *createFunc)

{
  bool bVar1;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar2;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar3;
  Type *func;
  Type *func_00;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> AVar4;
  Maybe<unsigned_long> local_128;
  undefined1 *local_118;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_110;
  undefined1 local_108 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:621:7)>
  _kjDefer625;
  StringPtr *newRow;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_c0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *local_b8;
  char (*local_b0) [7];
  undefined1 local_a8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
  _kjDefer619;
  bool success;
  unsigned_long *existing;
  StringPtr *local_60;
  size_t local_58;
  Maybe<unsigned_long> local_50;
  undefined1 local_40 [8];
  NullableValue<unsigned_long> _existing611;
  size_t pos;
  Type *createFunc_local;
  char (*params_local) [7];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table_local;
  
  _existing611.field_1.value =
       Vector<kj::HashMap<kj::String,_int>::Entry>::size
                 ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table);
  pHVar2 = get<0ul,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>&>(&table->indexes);
  AVar4 = Vector<kj::HashMap<kj::String,_int>::Entry>::asPtr
                    ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table);
  local_60 = AVar4.ptr;
  local_58 = AVar4.size_;
  AVar4.size_ = (size_t)local_60;
  AVar4.ptr = (StringPtr *)pHVar2;
  HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
  insert<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
            ((HashIndex<kj::HashMap<kj::String,int>::Callbacks> *)&local_50,AVar4,local_58,
             (char (*) [7])_existing611.field_1);
  other = kj::_::readMaybe<unsigned_long>(&local_50);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_40,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_50);
  puVar3 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_40);
  if (puVar3 == (unsigned_long *)0x0) {
    _kjDefer619.maybeFunc.ptr.field_1._27_1_ = 0;
    newRow = (StringPtr *)((long)&_kjDefer619.maybeFunc.ptr.field_1 + 0x1b);
    local_b8 = &_existing611.field_1;
    local_c0 = table;
    local_b0 = params;
    defer<kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>::FindOrCreateImpl<kj::_::(anonymous_namespace)::TestCase29::run()::__2,kj::StringPtr&>::apply<0ul>(kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>&,kj::StringPtr&,kj::_::(anonymous_namespace)::TestCase29::run()::__2&&)::_lambda()_1_>
              ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                *)local_a8,(kj *)&newRow,func);
    NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++:59:3)>
    ::Type::operator()((void *)((long)&_kjDefer625.maybeFunc.ptr.field_1 + 8));
    table_local = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                   *)Vector<kj::HashMap<kj::String,int>::Entry>::
                     add<kj::HashMap<kj::String,int>::Entry>
                               ((Vector<kj::HashMap<kj::String,int>::Entry> *)table,
                                (StringPtr *)((long)&_kjDefer625.maybeFunc.ptr.field_1 + 8));
    HashMap<kj::String,_int>::Entry::~Entry((Entry *)((long)&_kjDefer625.maybeFunc.ptr.field_1 + 8))
    ;
    local_118 = (undefined1 *)((long)&_kjDefer619.maybeFunc.ptr.field_1 + 0x1b);
    local_110 = table;
    defer<kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>::FindOrCreateImpl<kj::_::(anonymous_namespace)::TestCase29::run()::__2,kj::StringPtr&>::apply<0ul>(kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>&,kj::StringPtr&,kj::_::(anonymous_namespace)::TestCase29::run()::__2&&)::_lambda()_2_>
              ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:621:7)>
                *)local_108,(kj *)&local_118,func_00);
    Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
    ::Impl<0UL,_false>::insert
              ((Impl<0UL,_false> *)&local_128,table,_existing611.field_1.value,
               (StringPtr *)table_local,0);
    bVar1 = Maybe<unsigned_long>::operator==(&local_128);
    Maybe<unsigned_long>::~Maybe(&local_128);
    if (!bVar1) {
      kj::_::throwDuplicateTableRow();
    }
    _kjDefer619.maybeFunc.ptr.field_1._27_1_ = 1;
    _kjDefer619.maybeFunc.ptr.field_1._28_4_ = 1;
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:621:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:621:7)>
                 *)local_108);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                 *)local_a8);
  }
  else {
    puVar3 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_40);
    table_local = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                   *)Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                               ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table,*puVar3);
    _kjDefer619.maybeFunc.ptr.field_1._28_4_ = 1;
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_40);
  return (StringPtr *)table_local;
}

Assistant:

static Row& apply(Table<Row, Indexes...>& table, Params&&... params, Func&& createFunc) {
    auto pos = table.rows.size();
    KJ_IF_SOME(existing, get<index>(table.indexes).insert(table.rows.asPtr(), pos, params...)) {
      return table.rows[existing];
    } else {
      bool success = false;
      KJ_DEFER({
        if (!success) {
          get<index>(table.indexes).erase(table.rows.asPtr(), pos, params...);
        }
      });
      auto& newRow = table.rows.add(createFunc());
      KJ_DEFER({
        if (!success) {
          table.rows.removeLast();
        }
      });
      if (Table<Row, Indexes...>::template Impl<>::insert(table, pos, newRow, index) == kj::none) {
        success = true;
      } else {
        _::throwDuplicateTableRow();
      }
      return newRow;
    }